

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

bool ON_SubDQuadNeighborhood::GetSubdivisionPoint(ON_SubDEdge *edge,double *subdivision_point)

{
  bool bVar1;
  double Q [3];
  double local_38;
  double dStack_30;
  double local_28;
  
  if (subdivision_point != (double *)0x0) {
    if ((edge != (ON_SubDEdge *)0x0) &&
       (bVar1 = ON_SubDEdge::GetSubdivisionPoint(edge,&local_38), bVar1)) {
      do {
        *subdivision_point = local_38;
        subdivision_point[1] = dStack_30;
        subdivision_point[2] = local_28;
        bVar1 = ON_SubDEdge::GetSubdivisionPoint(edge,&local_38);
      } while (bVar1);
    }
    *subdivision_point = -1.23432101234321e+308;
    subdivision_point[1] = -1.23432101234321e+308;
    subdivision_point[2] = -1.23432101234321e+308;
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDQuadNeighborhood::GetSubdivisionPoint(
  const ON_SubDEdge* edge,
  double subdivision_point[3]
  )
{
  if (nullptr == subdivision_point)
    return ON_SUBD_RETURN_ERROR(false);
  for (;;)
  {
    if (nullptr==edge)
      break;
    double Q[3];
    if (!edge->GetSubdivisionPoint(Q))
      break;
    subdivision_point[0] = Q[0];
    subdivision_point[1] = Q[1];
    subdivision_point[2] = Q[2];
  }
  subdivision_point[0] = ON_UNSET_VALUE;
  subdivision_point[1] = ON_UNSET_VALUE;
  subdivision_point[2] = ON_UNSET_VALUE;
  return ON_SUBD_RETURN_ERROR(false);
}